

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

size_t mg_websocket_write(mg_connection *conn,int opcode,char *data,size_t data_len)

{
  uint *puVar1;
  uint uVar2;
  byte *buf;
  size_t sVar3;
  uint uVar4;
  ulong __size;
  uchar mem [4192];
  byte local_1098 [4200];
  
  buf = local_1098;
  __size = data_len + 10;
  if ((__size < 0x1061) || (buf = (byte *)malloc(__size), buf != (byte *)0x0)) {
    *buf = (byte)opcode & 0xf | 0x80;
    if (data_len < 0x7e) {
      buf[1] = (byte)data_len;
      memcpy(buf + 2,data,data_len);
      __size = data_len + 2;
    }
    else {
      uVar4 = (uint)data_len;
      if (data_len < 0x10000) {
        buf[1] = 0x7e;
        *(ushort *)(buf + 2) = (ushort)data_len << 8 | (ushort)data_len >> 8;
        memcpy(buf + 4,data,data_len);
        __size = data_len + 4;
      }
      else {
        buf[1] = 0x7f;
        uVar2 = (uint)(data_len >> 0x20);
        *(uint *)(buf + 2) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        *(uint *)(buf + 6) =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        memcpy(buf + 10,data,data_len);
      }
    }
    if (__size != 0) {
      ns_out((ns_connection *)conn[-1].callback_param,buf,(long)(int)__size);
    }
    if (buf != local_1098) {
      free(buf);
    }
    if (opcode == 8) {
      puVar1 = (uint *)((long)conn[-1].callback_param + 0x98);
      *puVar1 = *puVar1 | 1;
    }
    sVar3 = *(size_t *)((long)conn[-1].callback_param + 0x58);
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

size_t mg_websocket_write(struct mg_connection *conn, int opcode,
                       const char *data, size_t data_len) {
    unsigned char mem[4192], *copy = mem;
    size_t copy_len = 0;

    if (data_len + 10 > sizeof(mem) &&
        (copy = (unsigned char *) malloc(data_len + 10)) == NULL) {
      return 0;
    }

    copy[0] = 0x80 + (opcode & 0x0f);

    // Frame format: http://tools.ietf.org/html/rfc6455#section-5.2
    if (data_len < 126) {
      // Inline 7-bit length field
      copy[1] = data_len;
      memcpy(copy + 2, data, data_len);
      copy_len = 2 + data_len;
    } else if (data_len <= 0xFFFF) {
      // 16-bit length field
      copy[1] = 126;
      * (uint16_t *) (copy + 2) = (uint16_t) htons((uint16_t) data_len);
      memcpy(copy + 4, data, data_len);
      copy_len = 4 + data_len;
    } else {
      // 64-bit length field
      copy[1] = 127;
      * (uint32_t *) (copy + 2) = (uint32_t)
        htonl((uint32_t) ((uint64_t) data_len >> 32));
      * (uint32_t *) (copy + 6) = (uint32_t) htonl(data_len & 0xffffffff);
      memcpy(copy + 10, data, data_len);
      copy_len = 10 + data_len;
    }

    if (copy_len > 0) {
      mg_write(conn, copy, copy_len);
    }
    if (copy != mem) {
      free(copy);
    }

    // If we send closing frame, schedule a connection to be closed after
    // data is drained to the client.
    if (opcode == WEBSOCKET_OPCODE_CONNECTION_CLOSE) {
      MG_CONN_2_CONN(conn)->ns_conn->flags |= NSF_FINISHED_SENDING_DATA;
    }

    return MG_CONN_2_CONN(conn)->ns_conn->send_iobuf.len;
}